

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

String __thiscall
doctest::detail::stringifyBinaryExpr<std::__cxx11::string,char[4]>
          (detail *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs,
          char *op,char (*rhs) [4])

{
  String local_48;
  void *local_40;
  String local_38;
  void *local_30;
  
  StringMakerBase<true>::convert<std::__cxx11::string>((StringMakerBase<true> *)&local_40,lhs);
  String::String(&local_48,op);
  String::operator+(&local_38,(String *)&local_40);
  StringMakerBase<true>::convert<char[4]>((StringMakerBase<true> *)&local_30,rhs);
  String::operator+((String *)this,&local_38);
  free(local_30);
  free(local_38.m_str);
  free(local_48.m_str);
  free(local_40);
  return (String)(char *)this;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return toString(lhs) + op + toString(rhs);
    }